

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool cmListCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  string_view key;
  initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  init;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1a8;
  undefined8 local_190;
  char *local_188;
  code *local_180;
  undefined8 local_178;
  char *local_170;
  code *local_168;
  undefined8 local_160;
  char *local_158;
  code *local_150;
  undefined8 local_148;
  char *local_140;
  code *local_138;
  undefined8 local_130;
  char *local_128;
  code *local_120;
  undefined8 local_118;
  char *local_110;
  code *local_108;
  undefined8 local_100;
  char *local_f8;
  code *local_f0;
  undefined8 local_e8;
  char *local_e0;
  code *local_d8;
  undefined8 local_d0;
  char *local_c8;
  code *local_c0;
  undefined8 local_b8;
  char *local_b0;
  code *local_a8;
  undefined8 local_a0;
  char *local_98;
  code *local_90;
  undefined8 local_88;
  char *local_80;
  code *local_78;
  undefined8 local_70;
  char *local_68;
  code *local_60;
  undefined8 local_58;
  char *local_50;
  code *local_48;
  undefined8 local_40;
  char *local_38;
  code *local_30;
  undefined8 local_28;
  char *local_20;
  code *local_18;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    local_1a8.first.super_string_view._M_len = (size_t)&local_1a8.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,"must be called with at least two arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((_func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
         **)local_1a8.first.super_string_view._M_len != &local_1a8.second) {
      operator_delete((void *)local_1a8.first.super_string_view._M_len,(ulong)(local_1a8.second + 1)
                     );
    }
    bVar2 = false;
  }
  else {
    if (cmListCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::subcommand == '\0') {
      iVar3 = __cxa_guard_acquire(&cmListCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::subcommand);
      if (iVar3 != 0) {
        local_1a8.first.super_string_view._M_len = 6;
        local_1a8.first.super_string_view._M_str = "LENGTH";
        local_1a8.second = anon_unknown.dwarf_d0668d::HandleLengthCommand;
        local_190 = 3;
        local_188 = "GET";
        local_180 = anon_unknown.dwarf_d0668d::HandleGetCommand;
        local_178 = 6;
        local_170 = "APPEND";
        local_168 = anon_unknown.dwarf_d0668d::HandleAppendCommand;
        local_160 = 7;
        local_158 = "PREPEND";
        local_150 = anon_unknown.dwarf_d0668d::HandlePrependCommand;
        local_148 = 8;
        local_140 = "POP_BACK";
        local_138 = anon_unknown.dwarf_d0668d::HandlePopBackCommand;
        local_130 = 9;
        local_128 = "POP_FRONT";
        local_120 = anon_unknown.dwarf_d0668d::HandlePopFrontCommand;
        local_118 = 4;
        local_110 = "FIND";
        local_108 = anon_unknown.dwarf_d0668d::HandleFindCommand;
        local_100 = 6;
        local_f8 = "INSERT";
        local_f0 = anon_unknown.dwarf_d0668d::HandleInsertCommand;
        local_e8 = 4;
        local_e0 = "JOIN";
        local_d8 = anon_unknown.dwarf_d0668d::HandleJoinCommand;
        local_d0 = 9;
        local_c8 = "REMOVE_AT";
        local_c0 = anon_unknown.dwarf_d0668d::HandleRemoveAtCommand;
        local_b8 = 0xb;
        local_b0 = "REMOVE_ITEM";
        local_a8 = anon_unknown.dwarf_d0668d::HandleRemoveItemCommand;
        local_a0 = 0x11;
        local_98 = "REMOVE_DUPLICATES";
        local_90 = anon_unknown.dwarf_d0668d::HandleRemoveDuplicatesCommand;
        local_88 = 9;
        local_80 = "TRANSFORM";
        local_78 = anon_unknown.dwarf_d0668d::HandleTransformCommand;
        local_70 = 4;
        local_68 = "SORT";
        local_60 = anon_unknown.dwarf_d0668d::HandleSortCommand;
        local_58 = 7;
        local_50 = "SUBLIST";
        local_48 = anon_unknown.dwarf_d0668d::HandleSublistCommand;
        local_40 = 7;
        local_38 = "REVERSE";
        local_30 = anon_unknown.dwarf_d0668d::HandleReverseCommand;
        local_28 = 6;
        local_20 = "FILTER";
        local_18 = anon_unknown.dwarf_d0668d::HandleFilterCommand;
        init._M_len = 0x11;
        init._M_array = &local_1a8;
        cmSubcommandTable::cmSubcommandTable(&cmListCommand::subcommand,init);
        __cxa_atexit(cmSubcommandTable::~cmSubcommandTable,&cmListCommand::subcommand,&__dso_handle)
        ;
        __cxa_guard_release(&cmListCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::subcommand);
      }
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    key._M_str = (pbVar1->_M_dataplus)._M_p;
    key._M_len = pbVar1->_M_string_length;
    bVar2 = cmSubcommandTable::operator()(&cmListCommand::subcommand,key,args,status);
  }
  return bVar2;
}

Assistant:

bool cmListCommand(std::vector<std::string> const& args,
                   cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("must be called with at least two arguments.");
    return false;
  }

  static cmSubcommandTable const subcommand{
    { "LENGTH"_s, HandleLengthCommand },
    { "GET"_s, HandleGetCommand },
    { "APPEND"_s, HandleAppendCommand },
    { "PREPEND"_s, HandlePrependCommand },
    { "POP_BACK"_s, HandlePopBackCommand },
    { "POP_FRONT"_s, HandlePopFrontCommand },
    { "FIND"_s, HandleFindCommand },
    { "INSERT"_s, HandleInsertCommand },
    { "JOIN"_s, HandleJoinCommand },
    { "REMOVE_AT"_s, HandleRemoveAtCommand },
    { "REMOVE_ITEM"_s, HandleRemoveItemCommand },
    { "REMOVE_DUPLICATES"_s, HandleRemoveDuplicatesCommand },
    { "TRANSFORM"_s, HandleTransformCommand },
    { "SORT"_s, HandleSortCommand },
    { "SUBLIST"_s, HandleSublistCommand },
    { "REVERSE"_s, HandleReverseCommand },
    { "FILTER"_s, HandleFilterCommand },
  };

  return subcommand(args[0], args, status);
}